

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c
# Opt level: O3

LispPTR rpc(LispPTR *args)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar7;
  int *piVar8;
  ssize_t sVar9;
  char *pcVar10;
  DLword *pDVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  int dest;
  uint fromlen;
  timeval pertry_timeout;
  sockaddr_in sin1;
  sockaddr_in sin;
  sockaddr_in from;
  char hostname [100];
  fd_set read_descriptors;
  uint local_184;
  DLword *local_180;
  hostent *local_178;
  ulong local_170;
  ulong local_168;
  socklen_t local_15c;
  timeval local_158;
  sockaddr local_148;
  sockaddr local_138;
  sockaddr local_128;
  char local_118 [104];
  fd_set local_b0;
  long lVar6;
  
  uVar14 = *args;
  local_184 = *(ushort *)((ulong)(uVar14 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
  if ((ushort)((short)local_184 - 1U) < 2) {
    if ((uVar14 & 0xfff0000) == 0xf0000) {
      local_184 = uVar14 | 0xffff0000;
    }
    else if ((uVar14 & 0xfff0000) == 0xe0000) {
      local_184 = uVar14 & 0xffff;
    }
    else {
      if ((short)local_184 != 2) {
        return 0;
      }
      if ((uVar14 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar14);
      }
      local_184 = *(uint *)(Lisp_world + uVar14);
    }
    local_178 = gethostbyaddr(&local_184,4,2);
  }
  else {
    if ((uVar14 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar14);
    }
    iVar5 = *(int *)(Lisp_world + (ulong)uVar14 + 4);
    iVar2 = 100;
    if (iVar5 < 100) {
      iVar2 = iVar5;
    }
    lVar6 = (long)iVar2;
    if ((char)Lisp_world[(ulong)uVar14 + 3] == 'D') {
      if (iVar5 == 0) {
        pcVar10 = local_118;
      }
      else {
        lVar6 = lVar6 + (ulong)(lVar6 == 0);
        pDVar11 = Lisp_world +
                  (ulong)Lisp_world[(ulong)uVar14 + 2] +
                  (ulong)(*(uint *)(Lisp_world + uVar14) & 0xfffffff);
        pcVar10 = local_118;
        do {
          *pcVar10 = *(char *)((ulong)pDVar11 ^ 2);
          pcVar10 = pcVar10 + 1;
          pDVar11 = pDVar11 + 1;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      *pcVar10 = '\0';
    }
    else if ((char)Lisp_world[(ulong)uVar14 + 3] == 'C') {
      if (iVar5 != 0) {
        uVar3 = *(uint *)(Lisp_world + uVar14);
        uVar1 = Lisp_world[(ulong)uVar14 + 2];
        lVar13 = 0;
        do {
          local_118[lVar13] =
               *(char *)((long)Lisp_world + lVar13 + (ulong)uVar1 + (ulong)(uVar3 & 0xfffffff) * 2 ^
                        3);
          lVar13 = lVar13 + 1;
        } while (lVar6 + (ulong)(lVar6 == 0) != lVar13);
      }
      local_118[lVar6] = '\0';
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    local_178 = gethostbyname(local_118);
  }
  uVar14 = args[1];
  uVar16 = (ulong)uVar14;
  if ((uVar14 & 0xfff0000 | 0x10000) != 0xf0000) {
    if ((*(ushort *)((ulong)(uVar14 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      return 0;
    }
    if ((uVar14 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar16);
    }
    uVar16 = (ulong)*(uint *)(Lisp_world + uVar16);
  }
  pDVar11 = Lisp_world;
  uVar12 = (ulong)args[2];
  local_168 = (ulong)args[3];
  uVar14 = args[4];
  if ((uVar14 & 0xfff0000) == 0xf0000) {
    uVar14 = uVar14 | 0xffff0000;
  }
  else if ((uVar14 & 0xfff0000) == 0xe0000) {
    uVar14 = uVar14 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(uVar14 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      return 0;
    }
    if ((uVar14 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar14);
    }
    uVar14 = *(uint *)(Lisp_world + uVar14);
  }
  local_180 = pDVar11;
  uVar3 = args[5];
  local_170 = uVar12;
  if ((uVar3 & 0xfff0000) == 0xf0000) {
    uVar3 = uVar3 | 0xffff0000;
  }
  else if ((uVar3 & 0xfff0000) == 0xe0000) {
    uVar3 = uVar3 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(uVar3 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      return 0;
    }
    if ((uVar3 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar3);
    }
    uVar3 = *(uint *)(Lisp_world + uVar3);
  }
  uVar15 = args[6];
  if ((uVar15 & 0xfff0000) == 0xf0000) {
    uVar15 = uVar15 | 0xffff0000;
  }
  else if ((uVar15 & 0xfff0000) == 0xe0000) {
    uVar15 = uVar15 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(uVar15 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      return 0;
    }
    if ((uVar15 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar15);
    }
    uVar15 = *(uint *)(Lisp_world + uVar15);
  }
  local_158.tv_sec = (__time_t)((int)uVar3 / 1000);
  local_158.tv_usec = (__suseconds_t)((int)(uVar3 * 1000) % 1000000);
  uVar3 = socket(2,2,0);
  if ((int)uVar3 < 0) {
    return 0;
  }
  uVar4 = fcntl(uVar3,3,0);
  fcntl(uVar3,4,(ulong)(uVar4 | 0x800));
  local_138.sa_data[6] = '\0';
  local_138.sa_data[7] = '\0';
  local_138.sa_data[8] = '\0';
  local_138.sa_data[9] = '\0';
  local_138.sa_data[10] = '\0';
  local_138.sa_data[0xb] = '\0';
  local_138.sa_data[0xc] = '\0';
  local_138.sa_data[0xd] = '\0';
  local_138.sa_family = 2;
  local_138.sa_data[0] = '\0';
  local_138.sa_data[1] = '\0';
  local_138.sa_data[2] = '\0';
  local_138.sa_data[3] = '\0';
  local_138.sa_data[4] = '\0';
  local_138.sa_data[5] = '\0';
  bind(uVar3,&local_138,0x10);
  if (local_178 == (hostent *)0x0) {
    return 0;
  }
  pDVar11 = local_180 + local_170;
  local_148.sa_family = (sa_family_t)local_178->h_addrtype;
  memcpy(local_148.sa_data + 2,*local_178->h_addr_list,(long)local_178->h_length);
  local_148.sa_data._0_2_ = (ushort)uVar16 << 8 | (ushort)uVar16 >> 8;
  sVar7 = sendto(uVar3,pDVar11,(long)(int)uVar15,0,&local_148,0x10);
  if (sVar7 == (long)(int)uVar15) {
    pDVar11 = local_180 + local_168;
    local_168 = (ulong)((int)uVar14 / 1000);
    uVar16 = 1L << ((byte)uVar3 & 0x3f);
    local_170 = (ulong)((int)(uVar14 * 1000) % 1000000);
    local_178 = (hostent *)0x0;
    local_180 = (DLword *)0x0;
    do {
      do {
        while( true ) {
          local_b0.fds_bits[uVar3 >> 6] = local_b0.fds_bits[uVar3 >> 6] | uVar16;
          iVar5 = select(0x20,&local_b0,(fd_set *)0x0,(fd_set *)0x0,&local_158);
          if (iVar5 != -1) break;
          piVar8 = __errno_location();
          if (*piVar8 != 4) {
            return 0;
          }
        }
        if (iVar5 == 0) {
          local_178 = (hostent *)((long)local_178 + local_158.tv_usec);
          if ((long)local_178 < 1000000) {
            local_180 = (DLword *)((long)local_180 + local_158.tv_sec);
          }
          else {
            uVar12 = 1999999;
            if (local_178 < 1999999) {
              uVar12 = (ulong)local_178;
            }
            uVar12 = (((long)local_178 - uVar12) + 999999) / 1000000;
            local_180 = (DLword *)(uVar12 + local_158.tv_sec + (long)local_180 + 1);
            local_178 = (hostent *)(((long)local_178 - 1000000U) + uVar12 * -1000000);
          }
          if ((long)local_168 < (long)local_180) {
            return 0;
          }
          if ((local_180 == (DLword *)local_168) && ((long)local_170 <= (long)local_178)) {
            return 0;
          }
        }
      } while ((local_b0.fds_bits[uVar3 >> 6] & uVar16) == 0);
      do {
        local_15c = 0x10;
        sVar9 = recvfrom(uVar3,pDVar11,1000,0,&local_128,&local_15c);
        if (-1 < (int)sVar9) {
          close(uVar3);
          return 0x4c;
        }
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
    } while (*piVar8 == 0xb);
    return 0;
  }
  return 0;
}

Assistant:

LispPTR rpc(LispPTR *args)
{
#ifndef DOS
  /* Arguments are:
     args[0]:Destination Address; hostname or internet address are both supported.
     args[1]:Remote port for this program.
     args[2]:Argument block pointer.
     args[3]:Result Block pointer.
     args[4]:Milliseconds before timeout
     args[5]:Milliseconds between tries
     args[6]:Argument block length
     */
  char hostname[MAX_HOSTNAME_LENGTH];
  struct hostent *hp;
  struct sockaddr_in sin, sin1, from;
  char *outbuf, *inbuf, *destaddr;
  int s, msec_until_timeout, msec_between_tries, out_length;
  int received;
  int port;
  int dest;
  unsigned fromlen;
  fd_set read_descriptors;
  struct timeval pertry_timeout, total_timeout, time_waited;

  /* Set timeout */
  /* CONVERT FROM LISP TO C TYPES */
  dest = GetTypeNumber(args[0]);

  if ((dest == TYPE_FIXP) || (dest == TYPE_SMALLP)) {
    N_GETNUMBER(args[0], dest, handle_error);
    destaddr = (char *)&dest;
    hp = gethostbyaddr(destaddr, sizeof(struct in_addr), AF_INET);
  } else {
    /* Convert Hostname */
    LispStringToCString(args[0], hostname, MAX_HOSTNAME_LENGTH);
    hp = gethostbyname(hostname);
  }

  N_GETNUMBER(args[1], port, handle_error);

  /* Translate the buffer pointer into C pointers */
  outbuf = (char *)(NativeAligned2FromLAddr(args[2]));
  inbuf = (char *)(NativeAligned2FromLAddr(args[3]));

  N_GETNUMBER(args[4], msec_until_timeout, handle_error);

  N_GETNUMBER(args[5], msec_between_tries, handle_error);

  N_GETNUMBER(args[6], out_length, handle_error);

  /* Convert to micro seconds */
  msec_until_timeout = msec_until_timeout * 1000;
  msec_between_tries = msec_between_tries * 1000;

  /* Set up the timeouts */
  total_timeout.tv_sec = msec_until_timeout / 1000000;
  total_timeout.tv_usec = msec_until_timeout % 1000000;
  pertry_timeout.tv_sec = msec_between_tries / 1000000;
  pertry_timeout.tv_usec = msec_between_tries % 1000000;

  /* SET UP THE SOCKET */

  /* Open the socket; Might want to make this non-blocking */
  if ((s = socket(AF_INET, SOCK_DGRAM, 0)) < 0) goto handle_error;

  /* The sockets that rpc controls don't block */
  fcntl(s, F_SETFL, fcntl(s, F_GETFL, 0) | O_NONBLOCK);

  memset((char *)&sin, 0, sizeof(sin));
  sin.sin_family = AF_INET;
  bind(s, (struct sockaddr *)&sin, sizeof(sin));

  /* Resolve the host address. */
  if (hp) {
    sin1.sin_family = hp->h_addrtype;
    memcpy(&sin1.sin_addr, hp->h_addr, hp->h_length);
  } else
    goto handle_error;

  /* Convert to network byte order */
  sin1.sin_port = htons((u_short)port);

  /* Send buffer out on the socket */
  if (sendto(s, outbuf, out_length, 0, (struct sockaddr *)&sin1, sizeof(sin1)) != out_length)
    goto handle_error;

  /* Set up the timers */
  time_waited.tv_sec = 0;
  time_waited.tv_usec = 0;

/* Start the waiting loop */
receive:

  /* Set the select mask */
  FD_SET(s, &read_descriptors);

  switch (
      select(32, &read_descriptors, NULL, NULL, &pertry_timeout)) {
    /* Per try timeout expired, Check the total timeout */
    case 0:
      time_waited.tv_sec += pertry_timeout.tv_sec;
      time_waited.tv_usec += pertry_timeout.tv_usec;
      while (time_waited.tv_usec >= 1000000) {
        time_waited.tv_sec++;
        time_waited.tv_usec -= 1000000;
      }
      /* If the time waited is greater than the total
       * timeout then there's an error
       */
      if ((time_waited.tv_sec > total_timeout.tv_sec) ||
          ((time_waited.tv_sec == total_timeout.tv_sec) &&
           (time_waited.tv_usec >= total_timeout.tv_usec)))
        goto handle_error;
      else
        break;

    /* An error was generated, Unless it was a system error stop */
    case -1:
      if (errno == EINTR)
        goto receive;
      else
        goto handle_error;
  }
  /* Nothing arrived for this socket, try again */
  if (!FD_ISSET(s, &read_descriptors)) goto receive;

/* Something arrived; try to get it */

getbuf:
  fromlen = sizeof(struct sockaddr);
  received = recvfrom(s, inbuf, UDP_DATA_BLOCK_SIZE, 0, (struct sockaddr *)&from, &fromlen);
  if (received < 0) switch (errno) {
      case EINTR: goto getbuf;
      case EWOULDBLOCK: goto receive;
      default: goto handle_error;
    }

  /* close the socket */
  close(s);

  /* Return TRUE */
  return (ATOM_T);

/* Return NIL; Eventually we will need to return something more informative, perhaps errno
 * would be sufficient.
 */
handle_error:
  return (NIL_PTR);
#endif /* DOS */
}